

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O0

int __thiscall pbrt::SDFace::vnum(SDFace *this,SDVertex *vert)

{
  long in_RSI;
  long in_RDI;
  int i;
  char *in_stack_00000088;
  int in_stack_00000094;
  char *in_stack_00000098;
  LogLevel in_stack_000000a4;
  undefined4 local_14;
  
  local_14 = 0;
  while( true ) {
    if (2 < local_14) {
      LogFatal(in_stack_000000a4,in_stack_00000098,in_stack_00000094,in_stack_00000088);
    }
    if (*(long *)(in_RDI + (long)local_14 * 8) == in_RSI) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int vnum(SDVertex *vert) const {
        for (int i = 0; i < 3; ++i)
            if (v[i] == vert)
                return i;
        LOG_FATAL("Basic logic error in SDFace::vnum()");
        return -1;
    }